

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads_kernel_2.h
# Opt level: O2

void __thiscall dlib::signaler::signaler(signaler *this,mutex *assoc_mutex)

{
  thread_error *this_00;
  int iVar1;
  allocator<char> local_39;
  string local_38;
  
  this->associated_mutex = &assoc_mutex->myMutex;
  this->m = assoc_mutex;
  iVar1 = pthread_cond_init((pthread_cond_t *)&this->cond,(pthread_condattr_t *)0x0);
  if (iVar1 == 0) {
    return;
  }
  this_00 = (thread_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "in function signaler::signaler() an error occurred making the signaler",&local_39);
  thread_error::thread_error(this_00,ECREATE_SIGNALER,&local_38);
  __cxa_throw(this_00,&thread_error::typeinfo,error::~error);
}

Assistant:

signaler (
            const mutex& assoc_mutex
        ) :
            associated_mutex(&assoc_mutex.myMutex),
            m(assoc_mutex)
        { 
            if (pthread_cond_init(&cond,0))
            {
                throw dlib::thread_error(ECREATE_SIGNALER,
        "in function signaler::signaler() an error occurred making the signaler"
                );      
            }
        }